

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcBezierCurve::~IfcBezierCurve(IfcBezierCurve *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void *pvVar3;
  
  *(undefined8 *)
   &this[-1].super_IfcBSplineCurve.super_IfcBoundedCurve.super_IfcCurve.
    super_IfcGeometricRepresentationItem.field_0x28 = 0x93c010;
  *(undefined8 *)
   &(this->super_IfcBSplineCurve).super_IfcBoundedCurve.super_IfcCurve.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x93c0d8;
  *(undefined8 *)&this[-1].super_IfcBSplineCurve.super_IfcBoundedCurve.super_IfcCurve.field_0x38 =
       0x93c038;
  *(undefined8 *)&this[-1].super_IfcBSplineCurve.super_IfcBoundedCurve.field_0x48 = 0x93c060;
  this[-1].super_IfcBSplineCurve.ControlPointsList.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x93c088;
  this[-1].super_IfcBSplineCurve.ControlPointsList.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(IfcBSplineCurve-in-Assimp::IFC::Schema_2x3::IfcBezierCurve::construction_vtable +
                0xb8);
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[-1].field_0xd0 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[-1].field_0xd0);
  }
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &this[-1].super_IfcBSplineCurve.field_0xc0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = this[-1].super_IfcBSplineCurve.ClosedCurve.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  p_Var1 = &this[-1].super_IfcBSplineCurve.SelfIntersect.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1) {
    operator_delete(p_Var2,(ulong)((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1));
  }
  pvVar3 = (void *)this[-1].super_IfcBSplineCurve.CurveForm.field_2._M_allocated_capacity;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)this[-1].super_IfcBSplineCurve.ClosedCurve.
                                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr - (long)pvVar3);
  }
  operator_delete(&this[-1].super_IfcBSplineCurve.super_IfcBoundedCurve.super_IfcCurve.
                   super_IfcGeometricRepresentationItem.field_0x28,0xd8);
  return;
}

Assistant:

IfcBezierCurve() : Object("IfcBezierCurve") {}